

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O2

int qpdfjob_initialize_from_wide_argv(qpdfjob_handle j,wchar_t **argv)

{
  int iVar1;
  long lVar2;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  for (lVar2 = 0; argv[lVar2] != (wchar_t *)0x0; lVar2 = lVar2 + 1) {
  }
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<int_(int,_const_char_*const_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdfjob-c.cc:72:52)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<int_(int,_const_char_*const_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdfjob-c.cc:72:52)>
             ::_M_manager;
  local_28._M_unused._M_object = j;
  iVar1 = QUtil::call_main_from_wmain
                    ((int)lVar2,argv,(function<int_(int,_const_char_*const_*)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return iVar1;
}

Assistant:

int
qpdfjob_initialize_from_wide_argv(qpdfjob_handle j, wchar_t const* const argv[])
{
    int argc = 0;
    for (auto k = argv; *k; ++k) {
        ++argc;
    }
    return QUtil::call_main_from_wmain(argc, argv, [j](int, char const* const new_argv[]) {
        return qpdfjob_initialize_from_argv(j, new_argv);
    });
}